

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  undefined1 (*pauVar6) [16];
  undefined4 uVar7;
  ulong uVar8;
  undefined8 uVar9;
  Scene *pSVar10;
  RTCFilterFunctionN p_Var11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar19;
  int iVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar23;
  long lVar24;
  RTCRayN *pRVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  ulong uVar29;
  Geometry *pGVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar63;
  float fVar64;
  float fVar78;
  float fVar80;
  float fVar81;
  undefined1 auVar66 [16];
  uint uVar65;
  uint uVar79;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar82;
  float fVar89;
  float fVar90;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar86;
  float fVar91;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  float fVar92;
  float fVar93;
  float fVar107;
  float fVar109;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar97;
  float fVar108;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar116;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar117;
  float fVar124;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar125;
  undefined1 auVar123 [16];
  float fVar126;
  float fVar127;
  float fVar131;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar132;
  undefined1 auVar130 [16];
  float fVar133;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar142;
  float fVar143;
  float fVar149;
  float fVar151;
  float fVar153;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar150;
  float fVar152;
  float fVar154;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar155 [16];
  float fVar156;
  float fVar157;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar178;
  float fVar181;
  float fVar182;
  float fVar185;
  float fVar186;
  undefined1 auVar176 [16];
  float fVar179;
  float fVar180;
  float fVar183;
  float fVar184;
  float fVar187;
  float fVar188;
  undefined1 auVar177 [16];
  float fVar189;
  undefined1 auVar190 [16];
  vbool<4> valid;
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  long local_1320;
  undefined8 local_1318;
  undefined8 uStack_1310;
  RTCFilterFunctionNArguments args;
  undefined8 local_1298;
  undefined8 uStack_1290;
  undefined8 local_1288;
  undefined8 uStack_1280;
  vfloat<4> tNear;
  undefined1 local_1208 [16];
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [8];
  float fStack_11e0;
  float fStack_11dc;
  undefined1 local_11d8 [16];
  undefined1 local_11c8 [16];
  undefined1 local_11b8 [16];
  undefined1 local_11a8 [16];
  undefined1 local_1198 [8];
  float fStack_1190;
  float fStack_118c;
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  undefined1 local_1178 [8];
  float fStack_1170;
  float fStack_116c;
  float local_1168;
  float fStack_1164;
  float fStack_1160;
  float fStack_115c;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  long local_1148;
  ulong local_1140;
  undefined1 local_1138 [16];
  float local_1128;
  float fStack_1124;
  float fStack_1120;
  float fStack_111c;
  undefined1 local_1118 [16];
  undefined1 local_1108 [16];
  undefined4 local_10f8;
  undefined4 uStack_10f4;
  undefined4 uStack_10f0;
  undefined4 uStack_10ec;
  undefined4 local_10e8;
  undefined4 uStack_10e4;
  undefined4 uStack_10e0;
  undefined4 uStack_10dc;
  undefined4 local_10d8;
  undefined4 uStack_10d4;
  undefined4 uStack_10d0;
  undefined4 uStack_10cc;
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  uint local_10a8;
  uint uStack_10a4;
  uint uStack_10a0;
  uint uStack_109c;
  uint local_1098;
  uint uStack_1094;
  uint uStack_1090;
  uint uStack_108c;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  undefined8 local_1008;
  undefined8 uStack_1000;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar23 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar112 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar91 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar81 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar156 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar164 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar167 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar189 = fVar156 * 0.99999964;
  fVar126 = fVar164 * 0.99999964;
  fVar172 = fVar167 * 0.99999964;
  fVar156 = fVar156 * 1.0000004;
  fVar164 = fVar164 * 1.0000004;
  fVar167 = fVar167 * 1.0000004;
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar29 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1140 = uVar31 ^ 0x10;
  iVar20 = (tray->tnear).field_0.i[k];
  auVar99._4_4_ = iVar20;
  auVar99._0_4_ = iVar20;
  auVar99._8_4_ = iVar20;
  auVar99._12_4_ = iVar20;
  iVar20 = (tray->tfar).field_0.i[k];
  auVar43._4_4_ = iVar20;
  auVar43._0_4_ = iVar20;
  auVar43._8_4_ = iVar20;
  auVar43._12_4_ = iVar20;
  local_ff8 = mm_lookupmask_ps._0_8_;
  uStack_ff0 = mm_lookupmask_ps._8_8_;
  local_1008 = mm_lookupmask_ps._240_8_;
  uStack_1000 = mm_lookupmask_ps._248_8_;
  local_1018 = fVar112;
  fStack_1014 = fVar112;
  fStack_1010 = fVar112;
  fStack_100c = fVar112;
  local_1028 = fVar91;
  fStack_1024 = fVar91;
  fStack_1020 = fVar91;
  fStack_101c = fVar91;
  local_1038 = fVar81;
  fStack_1034 = fVar81;
  fStack_1030 = fVar81;
  fStack_102c = fVar81;
  local_1048 = fVar156;
  fStack_1044 = fVar156;
  fStack_1040 = fVar156;
  fStack_103c = fVar156;
  local_1058 = fVar164;
  fStack_1054 = fVar164;
  fStack_1050 = fVar164;
  fStack_104c = fVar164;
  local_1068 = fVar167;
  fStack_1064 = fVar167;
  fStack_1060 = fVar167;
  fStack_105c = fVar167;
  local_1078 = fVar172;
  fStack_1074 = fVar172;
  fStack_1070 = fVar172;
  fStack_106c = fVar172;
  local_1088 = fVar189;
  fStack_1084 = fVar189;
  fStack_1080 = fVar189;
  fStack_107c = fVar189;
  local_1128 = fVar126;
  fStack_1124 = fVar126;
  fStack_1120 = fVar126;
  fStack_111c = fVar126;
  local_1138 = auVar99;
  fVar182 = fVar126;
  fVar186 = fVar126;
  fVar117 = fVar126;
  fVar131 = fVar189;
  fVar127 = fVar189;
  fVar116 = fVar189;
  fVar111 = fVar172;
  fVar110 = fVar172;
  fVar109 = fVar172;
  fVar108 = fVar156;
  fVar107 = fVar156;
  fVar93 = fVar156;
  fVar92 = fVar81;
  fVar90 = fVar81;
  fVar89 = fVar81;
  fVar82 = fVar91;
  fVar80 = fVar91;
  fVar78 = fVar91;
  fVar64 = fVar112;
  fVar154 = fVar112;
  fVar152 = fVar112;
  fVar150 = fVar167;
  fVar143 = fVar167;
  fVar166 = fVar167;
  fVar165 = fVar164;
  fVar125 = fVar164;
  fVar124 = fVar164;
LAB_00273528:
  do {
    pSVar19 = pSVar23 + -1;
    pSVar23 = pSVar23 + -1;
    if ((float)pSVar19->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar19->dist == *(float *)(ray + k * 4 + 0x80)) {
      uVar28 = (pSVar23->ptr).ptr;
      while ((uVar28 & 8) == 0) {
        pfVar1 = (float *)(uVar28 + 0x20 + uVar31);
        auVar33._0_4_ = (*pfVar1 - fVar152) * fVar116;
        auVar33._4_4_ = (pfVar1[1] - fVar154) * fVar127;
        auVar33._8_4_ = (pfVar1[2] - fVar64) * fVar131;
        auVar33._12_4_ = (pfVar1[3] - fVar112) * fVar189;
        pfVar1 = (float *)(uVar28 + 0x20 + uVar29);
        auVar119._0_4_ = (*pfVar1 - fVar78) * fVar126;
        auVar119._4_4_ = (pfVar1[1] - fVar80) * fVar182;
        auVar119._8_4_ = (pfVar1[2] - fVar82) * fVar186;
        auVar119._12_4_ = (pfVar1[3] - fVar91) * fVar117;
        auVar33 = maxps(auVar33,auVar119);
        pfVar1 = (float *)(uVar28 + 0x20 + uVar32);
        auVar129._0_4_ = (*pfVar1 - fVar89) * fVar109;
        auVar129._4_4_ = (pfVar1[1] - fVar90) * fVar110;
        auVar129._8_4_ = (pfVar1[2] - fVar92) * fVar111;
        auVar129._12_4_ = (pfVar1[3] - fVar81) * fVar172;
        auVar83 = maxps(auVar129,auVar99);
        tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar33,auVar83);
        pfVar1 = (float *)(uVar28 + 0x20 + local_1140);
        auVar84._0_4_ = (*pfVar1 - fVar152) * fVar93;
        auVar84._4_4_ = (pfVar1[1] - fVar154) * fVar107;
        auVar84._8_4_ = (pfVar1[2] - fVar64) * fVar108;
        auVar84._12_4_ = (pfVar1[3] - fVar112) * fVar156;
        pfVar1 = (float *)(uVar28 + 0x20 + (uVar29 ^ 0x10));
        auVar94._0_4_ = (*pfVar1 - fVar78) * fVar124;
        auVar94._4_4_ = (pfVar1[1] - fVar80) * fVar125;
        auVar94._8_4_ = (pfVar1[2] - fVar82) * fVar165;
        auVar94._12_4_ = (pfVar1[3] - fVar91) * fVar164;
        auVar33 = minps(auVar84,auVar94);
        pfVar1 = (float *)(uVar28 + 0x20 + (uVar32 ^ 0x10));
        auVar95._0_4_ = (*pfVar1 - fVar89) * fVar166;
        auVar95._4_4_ = (pfVar1[1] - fVar90) * fVar143;
        auVar95._8_4_ = (pfVar1[2] - fVar92) * fVar150;
        auVar95._12_4_ = (pfVar1[3] - fVar81) * fVar167;
        auVar83 = minps(auVar95,auVar43);
        auVar33 = minps(auVar33,auVar83);
        auVar83._4_4_ = -(uint)(tNear.field_0._4_4_ <= auVar33._4_4_);
        auVar83._0_4_ = -(uint)(tNear.field_0._0_4_ <= auVar33._0_4_);
        auVar83._8_4_ = -(uint)(tNear.field_0._8_4_ <= auVar33._8_4_);
        auVar83._12_4_ = -(uint)(tNear.field_0._12_4_ <= auVar33._12_4_);
        uVar27 = movmskps((int)local_1140,auVar83);
        if (uVar27 == 0) {
          if (pSVar23 == stack) {
            return;
          }
          goto LAB_00273528;
        }
        uVar27 = uVar27 & 0xff;
        uVar26 = uVar28 & 0xfffffffffffffff0;
        lVar12 = 0;
        if (uVar27 != 0) {
          for (; (uVar27 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
          }
        }
        uVar28 = *(ulong *)(uVar26 + lVar12 * 8);
        uVar27 = uVar27 - 1 & uVar27;
        if (uVar27 != 0) {
          uVar65 = tNear.field_0.i[lVar12];
          lVar12 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
            }
          }
          uVar8 = *(ulong *)(uVar26 + lVar12 * 8);
          uVar79 = tNear.field_0.i[lVar12];
          uVar27 = uVar27 - 1 & uVar27;
          if (uVar27 == 0) {
            if (uVar65 < uVar79) {
              (pSVar23->ptr).ptr = uVar8;
              pSVar23->dist = uVar79;
              pSVar23 = pSVar23 + 1;
            }
            else {
              (pSVar23->ptr).ptr = uVar28;
              pSVar23->dist = uVar65;
              pSVar23 = pSVar23 + 1;
              uVar28 = uVar8;
            }
          }
          else {
            auVar85._8_4_ = uVar65;
            auVar85._0_8_ = uVar28;
            auVar85._12_4_ = 0;
            auVar113._8_4_ = uVar79;
            auVar113._0_8_ = uVar8;
            auVar113._12_4_ = 0;
            lVar12 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
              }
            }
            uVar9 = *(undefined8 *)(uVar26 + lVar12 * 8);
            iVar20 = tNear.field_0.i[lVar12];
            auVar96._8_4_ = iVar20;
            auVar96._0_8_ = uVar9;
            auVar96._12_4_ = 0;
            auVar34._8_4_ = -(uint)((int)uVar65 < (int)uVar79);
            uVar27 = uVar27 - 1 & uVar27;
            if (uVar27 == 0) {
              auVar34._4_4_ = auVar34._8_4_;
              auVar34._0_4_ = auVar34._8_4_;
              auVar34._12_4_ = auVar34._8_4_;
              auVar118._8_4_ = uVar79;
              auVar118._0_8_ = uVar8;
              auVar118._12_4_ = 0;
              auVar119 = blendvps(auVar118,auVar85,auVar34);
              auVar33 = blendvps(auVar85,auVar113,auVar34);
              auVar35._8_4_ = -(uint)(auVar119._8_4_ < iVar20);
              auVar35._4_4_ = auVar35._8_4_;
              auVar35._0_4_ = auVar35._8_4_;
              auVar35._12_4_ = auVar35._8_4_;
              auVar114._8_4_ = iVar20;
              auVar114._0_8_ = uVar9;
              auVar114._12_4_ = 0;
              auVar83 = blendvps(auVar114,auVar119,auVar35);
              auVar119 = blendvps(auVar119,auVar96,auVar35);
              auVar36._8_4_ = -(uint)(auVar33._8_4_ < auVar119._8_4_);
              auVar36._4_4_ = auVar36._8_4_;
              auVar36._0_4_ = auVar36._8_4_;
              auVar36._12_4_ = auVar36._8_4_;
              SVar97 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar119,auVar33,auVar36);
              SVar86 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar33,auVar119,auVar36);
              *pSVar23 = SVar86;
              pSVar23[1] = SVar97;
              uVar28 = auVar83._0_8_;
              pSVar23 = pSVar23 + 2;
            }
            else {
              lVar12 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> lVar12 & 1) == 0; lVar12 = lVar12 + 1) {
                }
              }
              auVar37._4_4_ = auVar34._8_4_;
              auVar37._0_4_ = auVar34._8_4_;
              auVar37._8_4_ = auVar34._8_4_;
              auVar37._12_4_ = auVar34._8_4_;
              auVar119 = blendvps(auVar113,auVar85,auVar37);
              auVar99 = blendvps(auVar85,auVar113,auVar37);
              auVar128._8_4_ = tNear.field_0.i[lVar12];
              auVar128._0_8_ = *(undefined8 *)(uVar26 + lVar12 * 8);
              auVar128._12_4_ = 0;
              auVar38._8_4_ = -(uint)(iVar20 < tNear.field_0.i[lVar12]);
              auVar38._4_4_ = auVar38._8_4_;
              auVar38._0_4_ = auVar38._8_4_;
              auVar38._12_4_ = auVar38._8_4_;
              auVar83 = blendvps(auVar128,auVar96,auVar38);
              auVar33 = blendvps(auVar96,auVar128,auVar38);
              auVar39._8_4_ = -(uint)(auVar99._8_4_ < auVar33._8_4_);
              auVar39._4_4_ = auVar39._8_4_;
              auVar39._0_4_ = auVar39._8_4_;
              auVar39._12_4_ = auVar39._8_4_;
              auVar129 = blendvps(auVar33,auVar99,auVar39);
              SVar86 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar99,auVar33,auVar39);
              auVar40._8_4_ = -(uint)(auVar119._8_4_ < auVar83._8_4_);
              auVar40._4_4_ = auVar40._8_4_;
              auVar40._0_4_ = auVar40._8_4_;
              auVar40._12_4_ = auVar40._8_4_;
              auVar99 = blendvps(auVar83,auVar119,auVar40);
              auVar33 = blendvps(auVar119,auVar83,auVar40);
              auVar41._8_4_ = -(uint)(auVar33._8_4_ < auVar129._8_4_);
              auVar41._4_4_ = auVar41._8_4_;
              auVar41._0_4_ = auVar41._8_4_;
              auVar41._12_4_ = auVar41._8_4_;
              SVar97 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar129,auVar33,auVar41);
              SVar120 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar33,auVar129,auVar41);
              *pSVar23 = SVar86;
              pSVar23[1] = SVar120;
              pSVar23[2] = SVar97;
              uVar28 = auVar99._0_8_;
              pSVar23 = pSVar23 + 3;
              auVar99 = local_1138;
              fVar126 = local_1128;
              fVar182 = fStack_1124;
              fVar186 = fStack_1120;
              fVar117 = fStack_111c;
            }
          }
        }
      }
      local_1148 = (ulong)((uint)uVar28 & 0xf) - 8;
      if (local_1148 != 0) {
        uVar28 = uVar28 & 0xfffffffffffffff0;
        local_1320 = 0;
        do {
          lVar24 = local_1320 * 0xe0;
          puVar5 = (undefined8 *)(uVar28 + 0xd0 + lVar24);
          local_1288 = *puVar5;
          uStack_1280 = puVar5[1];
          fVar112 = *(float *)(ray + k * 4);
          fVar91 = *(float *)(ray + k * 4 + 0x10);
          fVar81 = *(float *)(ray + k * 4 + 0x20);
          pfVar1 = (float *)(uVar28 + lVar24);
          pfVar2 = (float *)(uVar28 + 0x10 + lVar24);
          pfVar3 = (float *)(uVar28 + 0x20 + lVar24);
          pfVar4 = (float *)(uVar28 + 0x30 + lVar24);
          fVar126 = *pfVar4;
          fVar182 = pfVar4[1];
          fVar186 = pfVar4[2];
          fVar117 = pfVar4[3];
          local_1158 = *pfVar1 - fVar112;
          fStack_1154 = pfVar1[1] - fVar112;
          fStack_1150 = pfVar1[2] - fVar112;
          fStack_114c = pfVar1[3] - fVar112;
          local_1168 = *pfVar2 - fVar91;
          fStack_1164 = pfVar2[1] - fVar91;
          fStack_1160 = pfVar2[2] - fVar91;
          fStack_115c = pfVar2[3] - fVar91;
          local_1178._0_4_ = *pfVar3 - fVar81;
          local_1178._4_4_ = pfVar3[1] - fVar81;
          fStack_1170 = pfVar3[2] - fVar81;
          fStack_116c = pfVar3[3] - fVar81;
          fVar142 = fVar126 - fVar112;
          fVar149 = fVar182 - fVar112;
          fVar151 = fVar186 - fVar112;
          fVar153 = fVar117 - fVar112;
          pfVar1 = (float *)(uVar28 + 0x40 + lVar24);
          fVar124 = *pfVar1;
          fVar125 = pfVar1[1];
          fVar165 = pfVar1[2];
          fVar166 = pfVar1[3];
          fVar92 = fVar124 - fVar91;
          fVar107 = fVar125 - fVar91;
          fVar109 = fVar165 - fVar91;
          fVar111 = fVar166 - fVar91;
          pfVar1 = (float *)(uVar28 + 0x50 + lVar24);
          fVar143 = *pfVar1;
          fVar150 = pfVar1[1];
          fVar152 = pfVar1[2];
          fVar154 = pfVar1[3];
          fVar127 = fVar143 - fVar81;
          fVar131 = fVar150 - fVar81;
          fVar189 = fVar152 - fVar81;
          fVar132 = fVar154 - fVar81;
          pfVar1 = (float *)(uVar28 + 0x90 + lVar24);
          local_1298 = *(undefined8 *)pfVar1;
          uStack_1290 = *(undefined8 *)(pfVar1 + 2);
          fVar93 = *pfVar1 - fVar112;
          fVar108 = pfVar1[1] - fVar112;
          fVar110 = pfVar1[2] - fVar112;
          fVar112 = pfVar1[3] - fVar112;
          pfVar1 = (float *)(uVar28 + 0xa0 + lVar24);
          local_1318 = *(Geometry **)pfVar1;
          uStack_1310 = *(undefined8 *)(pfVar1 + 2);
          fVar82 = *pfVar1 - fVar91;
          fVar89 = pfVar1[1] - fVar91;
          fVar90 = pfVar1[2] - fVar91;
          fVar91 = pfVar1[3] - fVar91;
          pauVar6 = (undefined1 (*) [16])(uVar28 + 0xb0 + lVar24);
          auVar99 = *pauVar6;
          fVar64 = *(float *)*pauVar6 - fVar81;
          fVar78 = *(float *)(*pauVar6 + 4) - fVar81;
          fVar80 = *(float *)(*pauVar6 + 8) - fVar81;
          fVar81 = *(float *)(*pauVar6 + 0xc) - fVar81;
          local_1188 = fVar93 - local_1158;
          fStack_1184 = fVar108 - fStack_1154;
          fStack_1180 = fVar110 - fStack_1150;
          fStack_117c = fVar112 - fStack_114c;
          local_f88 = fVar82 - local_1168;
          fStack_f84 = fVar89 - fStack_1164;
          fStack_f80 = fVar90 - fStack_1160;
          fStack_f7c = fVar91 - fStack_115c;
          local_1198._0_4_ = fVar64 - (float)local_1178._0_4_;
          local_1198._4_4_ = fVar78 - (float)local_1178._4_4_;
          fStack_1190 = fVar80 - fStack_1170;
          fStack_118c = fVar81 - fStack_116c;
          fVar156 = *(float *)(ray + k * 4 + 0x50);
          fVar164 = *(float *)(ray + k * 4 + 0x60);
          fVar167 = *(float *)(ray + k * 4 + 0x40);
          fVar172 = (local_f88 * ((float)local_1178._0_4_ + fVar64) -
                    (local_1168 + fVar82) * (float)local_1198._0_4_) * fVar167 +
                    ((local_1158 + fVar93) * (float)local_1198._0_4_ -
                    ((float)local_1178._0_4_ + fVar64) * local_1188) * fVar156 +
                    (local_1188 * (local_1168 + fVar82) - (local_1158 + fVar93) * local_f88) *
                    fVar164;
          fVar116 = (fStack_f84 * ((float)local_1178._4_4_ + fVar78) -
                    (fStack_1164 + fVar89) * (float)local_1198._4_4_) * fVar167 +
                    ((fStack_1154 + fVar108) * (float)local_1198._4_4_ -
                    ((float)local_1178._4_4_ + fVar78) * fStack_1184) * fVar156 +
                    (fStack_1184 * (fStack_1164 + fVar89) - (fStack_1154 + fVar108) * fStack_f84) *
                    fVar164;
          local_fd8._0_8_ = CONCAT44(fVar116,fVar172);
          local_fd8._8_4_ =
               (fStack_f80 * (fStack_1170 + fVar80) - (fStack_1160 + fVar90) * fStack_1190) *
               fVar167 + ((fStack_1150 + fVar110) * fStack_1190 -
                         (fStack_1170 + fVar80) * fStack_1180) * fVar156 +
                         (fStack_1180 * (fStack_1160 + fVar90) -
                         (fStack_1150 + fVar110) * fStack_f80) * fVar164;
          local_fd8._12_4_ =
               (fStack_f7c * (fStack_116c + fVar81) - (fStack_115c + fVar91) * fStack_118c) *
               fVar167 + ((fStack_114c + fVar112) * fStack_118c -
                         (fStack_116c + fVar81) * fStack_117c) * fVar156 +
                         (fStack_117c * (fStack_115c + fVar91) -
                         (fStack_114c + fVar112) * fStack_f7c) * fVar164;
          fVar157 = local_1158 - fVar142;
          fVar161 = fStack_1154 - fVar149;
          fVar162 = fStack_1150 - fVar151;
          fVar163 = fStack_114c - fVar153;
          fVar133 = local_1168 - fVar92;
          fVar137 = fStack_1164 - fVar107;
          fVar138 = fStack_1160 - fVar109;
          fVar139 = fStack_115c - fVar111;
          local_fa8 = (float)local_1178._0_4_ - fVar127;
          fStack_fa4 = (float)local_1178._4_4_ - fVar131;
          fStack_fa0 = fStack_1170 - fVar189;
          fStack_f9c = fStack_116c - fVar132;
          local_fc8._0_4_ =
               (fVar133 * ((float)local_1178._0_4_ + fVar127) - (local_1168 + fVar92) * local_fa8) *
               fVar167 + ((local_1158 + fVar142) * local_fa8 -
                         ((float)local_1178._0_4_ + fVar127) * fVar157) * fVar156 +
                         (fVar157 * (local_1168 + fVar92) - (local_1158 + fVar142) * fVar133) *
                         fVar164;
          local_fc8._4_4_ =
               (fVar137 * ((float)local_1178._4_4_ + fVar131) - (fStack_1164 + fVar107) * fStack_fa4
               ) * fVar167 +
               ((fStack_1154 + fVar149) * fStack_fa4 - ((float)local_1178._4_4_ + fVar131) * fVar161
               ) * fVar156 +
               (fVar161 * (fStack_1164 + fVar107) - (fStack_1154 + fVar149) * fVar137) * fVar164;
          local_fc8._8_4_ =
               (fVar138 * (fStack_1170 + fVar189) - (fStack_1160 + fVar109) * fStack_fa0) * fVar167
               + ((fStack_1150 + fVar151) * fStack_fa0 - (fStack_1170 + fVar189) * fVar162) *
                 fVar156 + (fVar162 * (fStack_1160 + fVar109) - (fStack_1150 + fVar151) * fVar138) *
                           fVar164;
          local_fc8._12_4_ =
               (fVar139 * (fStack_116c + fVar132) - (fStack_115c + fVar111) * fStack_f9c) * fVar167
               + ((fStack_114c + fVar153) * fStack_f9c - (fStack_116c + fVar132) * fVar163) *
                 fVar156 + (fVar163 * (fStack_115c + fVar111) - (fStack_114c + fVar153) * fVar139) *
                           fVar164;
          fVar168 = fVar142 - fVar93;
          fVar169 = fVar149 - fVar108;
          fVar170 = fVar151 - fVar110;
          fVar171 = fVar153 - fVar112;
          fVar173 = fVar92 - fVar82;
          fVar178 = fVar107 - fVar89;
          fVar181 = fVar109 - fVar90;
          fVar185 = fVar111 - fVar91;
          local_f98 = fVar127 - fVar64;
          fStack_f94 = fVar131 - fVar78;
          fStack_f90 = fVar189 - fVar80;
          fStack_f8c = fVar132 - fVar81;
          fVar64 = (fVar173 * (fVar64 + fVar127) - (fVar82 + fVar92) * local_f98) * fVar167 +
                   ((fVar93 + fVar142) * local_f98 - (fVar64 + fVar127) * fVar168) * fVar156 +
                   (fVar168 * (fVar82 + fVar92) - (fVar93 + fVar142) * fVar173) * fVar164;
          fVar92 = (fVar178 * (fVar78 + fVar131) - (fVar89 + fVar107) * fStack_f94) * fVar167 +
                   ((fVar108 + fVar149) * fStack_f94 - (fVar78 + fVar131) * fVar169) * fVar156 +
                   (fVar169 * (fVar89 + fVar107) - (fVar108 + fVar149) * fVar178) * fVar164;
          fVar90 = (fVar181 * (fVar80 + fVar189) - (fVar90 + fVar109) * fStack_f90) * fVar167 +
                   ((fVar110 + fVar151) * fStack_f90 - (fVar80 + fVar189) * fVar170) * fVar156 +
                   (fVar170 * (fVar90 + fVar109) - (fVar110 + fVar151) * fVar181) * fVar164;
          fVar112 = (fVar185 * (fVar81 + fVar132) - (fVar91 + fVar111) * fStack_f8c) * fVar167 +
                    ((fVar112 + fVar153) * fStack_f8c - (fVar81 + fVar132) * fVar171) * fVar156 +
                    (fVar171 * (fVar91 + fVar111) - (fVar112 + fVar153) * fVar185) * fVar164;
          fVar78 = local_fc8._0_4_ + fVar172 + fVar64;
          fVar80 = local_fc8._4_4_ + fVar116 + fVar92;
          fVar82 = local_fc8._8_4_ + local_fd8._8_4_ + fVar90;
          fVar89 = local_fc8._12_4_ + local_fd8._12_4_ + fVar112;
          auVar42._8_4_ = local_fd8._8_4_;
          auVar42._0_8_ = local_fd8._0_8_;
          auVar42._12_4_ = local_fd8._12_4_;
          auVar43 = minps(auVar42,local_fc8);
          auVar13._4_4_ = fVar92;
          auVar13._0_4_ = fVar64;
          auVar13._8_4_ = fVar90;
          auVar13._12_4_ = fVar112;
          auVar43 = minps(auVar43,auVar13);
          auVar144._8_4_ = local_fd8._8_4_;
          auVar144._0_8_ = local_fd8._0_8_;
          auVar144._12_4_ = local_fd8._12_4_;
          auVar33 = maxps(auVar144,local_fc8);
          auVar14._4_4_ = fVar92;
          auVar14._0_4_ = fVar64;
          auVar14._8_4_ = fVar90;
          auVar14._12_4_ = fVar112;
          auVar33 = maxps(auVar33,auVar14);
          fVar112 = ABS(fVar78) * 1.1920929e-07;
          fVar91 = ABS(fVar80) * 1.1920929e-07;
          fVar81 = ABS(fVar82) * 1.1920929e-07;
          fVar64 = ABS(fVar89) * 1.1920929e-07;
          auVar145._4_4_ = -(uint)(auVar33._4_4_ <= fVar91);
          auVar145._0_4_ = -(uint)(auVar33._0_4_ <= fVar112);
          auVar145._8_4_ = -(uint)(auVar33._8_4_ <= fVar81);
          auVar145._12_4_ = -(uint)(auVar33._12_4_ <= fVar64);
          auVar44._4_4_ = -(uint)(-fVar91 <= auVar43._4_4_);
          auVar44._0_4_ = -(uint)(-fVar112 <= auVar43._0_4_);
          auVar44._8_4_ = -(uint)(-fVar81 <= auVar43._8_4_);
          auVar44._12_4_ = -(uint)(-fVar64 <= auVar43._12_4_);
          auVar145 = auVar145 | auVar44;
          lVar12 = uVar28 + lVar24;
          uVar22 = (undefined4)((ulong)lVar24 >> 0x20);
          uVar27 = movmskps((int)lVar24,auVar145);
          if (uVar27 != 0) {
            local_fe8 = fVar78;
            fStack_fe4 = fVar80;
            fStack_fe0 = fVar82;
            fStack_fdc = fVar89;
            local_fb8 = fVar168;
            fStack_fb4 = fVar169;
            fStack_fb0 = fVar170;
            fStack_fac = fVar171;
            auVar98._0_4_ = local_f88 * local_fa8 - fVar133 * (float)local_1198._0_4_;
            auVar98._4_4_ = fStack_f84 * fStack_fa4 - fVar137 * (float)local_1198._4_4_;
            auVar98._8_4_ = fStack_f80 * fStack_fa0 - fVar138 * fStack_1190;
            auVar98._12_4_ = fStack_f7c * fStack_f9c - fVar139 * fStack_118c;
            auVar140._0_4_ = fVar133 * local_f98 - local_fa8 * fVar173;
            auVar140._4_4_ = fVar137 * fStack_f94 - fStack_fa4 * fVar178;
            auVar140._8_4_ = fVar138 * fStack_f90 - fStack_fa0 * fVar181;
            auVar140._12_4_ = fVar139 * fStack_f8c - fStack_f9c * fVar185;
            auVar45._4_4_ =
                 -(uint)(ABS(fVar137 * (float)local_1198._4_4_) < ABS(fStack_fa4 * fVar178));
            auVar45._0_4_ =
                 -(uint)(ABS(fVar133 * (float)local_1198._0_4_) < ABS(local_fa8 * fVar173));
            auVar45._8_4_ = -(uint)(ABS(fVar138 * fStack_1190) < ABS(fStack_fa0 * fVar181));
            auVar45._12_4_ = -(uint)(ABS(fVar139 * fStack_118c) < ABS(fStack_f9c * fVar185));
            local_11d8 = blendvps(auVar140,auVar98,auVar45);
            auVar121._0_4_ = (float)local_1198._0_4_ * fVar157 - local_fa8 * local_1188;
            auVar121._4_4_ = (float)local_1198._4_4_ * fVar161 - fStack_fa4 * fStack_1184;
            auVar121._8_4_ = fStack_1190 * fVar162 - fStack_fa0 * fStack_1180;
            auVar121._12_4_ = fStack_118c * fVar163 - fStack_f9c * fStack_117c;
            auVar134._0_4_ = local_fa8 * fVar168 - fVar157 * local_f98;
            auVar134._4_4_ = fStack_fa4 * fVar169 - fVar161 * fStack_f94;
            auVar134._8_4_ = fStack_fa0 * fVar170 - fVar162 * fStack_f90;
            auVar134._12_4_ = fStack_f9c * fVar171 - fVar163 * fStack_f8c;
            auVar46._4_4_ = -(uint)(ABS(fStack_fa4 * fStack_1184) < ABS(fVar161 * fStack_f94));
            auVar46._0_4_ = -(uint)(ABS(local_fa8 * local_1188) < ABS(fVar157 * local_f98));
            auVar46._8_4_ = -(uint)(ABS(fStack_fa0 * fStack_1180) < ABS(fVar162 * fStack_f90));
            auVar46._12_4_ = -(uint)(ABS(fStack_f9c * fStack_117c) < ABS(fVar163 * fStack_f8c));
            local_11c8 = blendvps(auVar134,auVar121,auVar46);
            auVar158._0_4_ = local_1188 * fVar133 - fVar157 * local_f88;
            auVar158._4_4_ = fStack_1184 * fVar137 - fVar161 * fStack_f84;
            auVar158._8_4_ = fStack_1180 * fVar138 - fVar162 * fStack_f80;
            auVar158._12_4_ = fStack_117c * fVar139 - fVar163 * fStack_f7c;
            auVar155._0_4_ = fVar157 * fVar173 - fVar133 * fVar168;
            auVar155._4_4_ = fVar161 * fVar178 - fVar137 * fVar169;
            auVar155._8_4_ = fVar162 * fVar181 - fVar138 * fVar170;
            auVar155._12_4_ = fVar163 * fVar185 - fVar139 * fVar171;
            auVar47._4_4_ = -(uint)(ABS(fVar161 * fStack_f84) < ABS(fVar137 * fVar169));
            auVar47._0_4_ = -(uint)(ABS(fVar157 * local_f88) < ABS(fVar133 * fVar168));
            auVar47._8_4_ = -(uint)(ABS(fVar162 * fStack_f80) < ABS(fVar138 * fVar170));
            auVar47._12_4_ = -(uint)(ABS(fVar163 * fStack_f7c) < ABS(fVar139 * fVar171));
            local_11b8 = blendvps(auVar155,auVar158,auVar47);
            fVar112 = fVar167 * local_11d8._0_4_ +
                      fVar156 * local_11c8._0_4_ + fVar164 * local_11b8._0_4_;
            fVar91 = fVar167 * local_11d8._4_4_ +
                     fVar156 * local_11c8._4_4_ + fVar164 * local_11b8._4_4_;
            fVar81 = fVar167 * local_11d8._8_4_ +
                     fVar156 * local_11c8._8_4_ + fVar164 * local_11b8._8_4_;
            fVar156 = fVar167 * local_11d8._12_4_ +
                      fVar156 * local_11c8._12_4_ + fVar164 * local_11b8._12_4_;
            auVar122._0_4_ = fVar112 + fVar112;
            auVar122._4_4_ = fVar91 + fVar91;
            auVar122._8_4_ = fVar81 + fVar81;
            auVar122._12_4_ = fVar156 + fVar156;
            auVar48._0_4_ =
                 local_1168 * local_11c8._0_4_ + (float)local_1178._0_4_ * local_11b8._0_4_;
            auVar48._4_4_ =
                 fStack_1164 * local_11c8._4_4_ + (float)local_1178._4_4_ * local_11b8._4_4_;
            auVar48._8_4_ = fStack_1160 * local_11c8._8_4_ + fStack_1170 * local_11b8._8_4_;
            auVar48._12_4_ = fStack_115c * local_11c8._12_4_ + fStack_116c * local_11b8._12_4_;
            fVar164 = local_1158 * local_11d8._0_4_ + auVar48._0_4_;
            fVar167 = fStack_1154 * local_11d8._4_4_ + auVar48._4_4_;
            fVar64 = fStack_1150 * local_11d8._8_4_ + auVar48._8_4_;
            fVar90 = fStack_114c * local_11d8._12_4_ + auVar48._12_4_;
            auVar43 = rcpps(auVar48,auVar122);
            fVar112 = auVar43._0_4_;
            fVar91 = auVar43._4_4_;
            fVar81 = auVar43._8_4_;
            fVar156 = auVar43._12_4_;
            fVar164 = ((1.0 - auVar122._0_4_ * fVar112) * fVar112 + fVar112) * (fVar164 + fVar164);
            fVar167 = ((1.0 - auVar122._4_4_ * fVar91) * fVar91 + fVar91) * (fVar167 + fVar167);
            fVar81 = ((1.0 - auVar122._8_4_ * fVar81) * fVar81 + fVar81) * (fVar64 + fVar64);
            fVar156 = ((1.0 - auVar122._12_4_ * fVar156) * fVar156 + fVar156) * (fVar90 + fVar90);
            fVar112 = *(float *)(ray + k * 4 + 0x80);
            local_1348 = ZEXT416((uint)fVar112);
            fVar91 = *(float *)(ray + k * 4 + 0x30);
            auVar66._0_4_ = -(uint)(fVar164 <= fVar112 && fVar91 <= fVar164) & auVar145._0_4_;
            auVar66._4_4_ = -(uint)(fVar167 <= fVar112 && fVar91 <= fVar167) & auVar145._4_4_;
            auVar66._8_4_ = -(uint)(fVar81 <= fVar112 && fVar91 <= fVar81) & auVar145._8_4_;
            auVar66._12_4_ = -(uint)(fVar156 <= fVar112 && fVar91 <= fVar156) & auVar145._12_4_;
            uVar27 = movmskps(uVar27,auVar66);
            if (uVar27 != 0) {
              uVar65 = auVar66._0_4_ & -(uint)(auVar122._0_4_ != 0.0);
              uVar79 = auVar66._4_4_ & -(uint)(auVar122._4_4_ != 0.0);
              valid.field_0._0_8_ = CONCAT44(uVar79,uVar65);
              valid.field_0.i[2] = auVar66._8_4_ & -(uint)(auVar122._8_4_ != 0.0);
              valid.field_0.i[3] = auVar66._12_4_ & -(uint)(auVar122._12_4_ != 0.0);
              uVar27 = movmskps(uVar27,(undefined1  [16])valid.field_0);
              auVar99 = *pauVar6;
              if (uVar27 != 0) {
                tNear.field_0.v[2] = local_fd8._8_4_;
                tNear.field_0._0_8_ = local_fd8._0_8_;
                tNear.field_0.v[3] = local_fd8._12_4_;
                auVar18._4_4_ = fVar80;
                auVar18._0_4_ = fVar78;
                auVar18._8_4_ = fVar82;
                auVar18._12_4_ = fVar89;
                auVar135._4_4_ = fVar167;
                auVar135._0_4_ = fVar164;
                auVar135._8_4_ = fVar81;
                auVar135._12_4_ = fVar156;
                _local_11e8 = auVar135;
                local_11a8._8_8_ = uStack_ff0;
                local_11a8._0_8_ = local_ff8;
                pSVar10 = context->scene;
                auVar99 = rcpps(*pauVar6,auVar18);
                fVar91 = auVar99._0_4_;
                fVar126 = auVar99._4_4_;
                fVar182 = auVar99._8_4_;
                fVar186 = auVar99._12_4_;
                fVar117 = (float)DAT_01f7ba10;
                fVar124 = DAT_01f7ba10._4_4_;
                fVar125 = DAT_01f7ba10._12_4_;
                fVar112 = DAT_01f7ba10._8_4_;
                fVar91 = (float)(-(uint)(1e-18 <= ABS(fVar78)) &
                                (uint)((fVar117 - fVar78 * fVar91) * fVar91 + fVar91));
                fVar126 = (float)(-(uint)(1e-18 <= ABS(fVar80)) &
                                 (uint)((fVar124 - fVar80 * fVar126) * fVar126 + fVar126));
                fVar182 = (float)(-(uint)(1e-18 <= ABS(fVar82)) &
                                 (uint)((fVar112 - fVar82 * fVar182) * fVar182 + fVar182));
                fVar186 = (float)(-(uint)(1e-18 <= ABS(fVar89)) &
                                 (uint)((fVar125 - fVar89 * fVar186) * fVar186 + fVar186));
                auVar159._0_4_ = fVar172 * fVar91;
                auVar159._4_4_ = fVar116 * fVar126;
                auVar159._8_4_ = local_fd8._8_4_ * fVar182;
                auVar159._12_4_ = local_fd8._12_4_ * fVar186;
                auVar99 = minps(auVar159,_DAT_01f7ba10);
                auVar176._0_4_ = fVar91 * local_fc8._0_4_;
                auVar176._4_4_ = fVar126 * local_fc8._4_4_;
                auVar176._8_4_ = fVar182 * local_fc8._8_4_;
                auVar176._12_4_ = fVar186 * local_fc8._12_4_;
                auVar43 = minps(auVar176,_DAT_01f7ba10);
                auVar87._0_4_ = fVar117 - auVar99._0_4_;
                auVar87._4_4_ = fVar124 - auVar99._4_4_;
                auVar87._8_4_ = fVar112 - auVar99._8_4_;
                auVar87._12_4_ = fVar125 - auVar99._12_4_;
                auVar100._0_4_ = fVar117 - auVar43._0_4_;
                auVar100._4_4_ = fVar124 - auVar43._4_4_;
                auVar100._8_4_ = fVar112 - auVar43._8_4_;
                auVar100._12_4_ = fVar125 - auVar43._12_4_;
                local_1208 = blendvps(auVar99,auVar87,local_11a8);
                local_11f8 = blendvps(auVar43,auVar100,local_11a8);
                auVar49._8_4_ = valid.field_0.i[2];
                auVar49._0_8_ = valid.field_0._0_8_;
                auVar49._12_4_ = valid.field_0.i[3];
                auVar43 = blendvps(_DAT_01f7a9f0,auVar135,auVar49);
                auVar101._4_4_ = auVar43._0_4_;
                auVar101._0_4_ = auVar43._4_4_;
                auVar101._8_4_ = auVar43._12_4_;
                auVar101._12_4_ = auVar43._8_4_;
                auVar99 = minps(auVar101,auVar43);
                auVar50._0_8_ = auVar99._8_8_;
                auVar50._8_4_ = auVar99._0_4_;
                auVar50._12_4_ = auVar99._4_4_;
                auVar99 = minps(auVar50,auVar99);
                auVar51._0_8_ =
                     CONCAT44(-(uint)(auVar99._4_4_ == auVar43._4_4_) & uVar79,
                              -(uint)(auVar99._0_4_ == auVar43._0_4_) & uVar65);
                auVar51._8_4_ = -(uint)(auVar99._8_4_ == auVar43._8_4_) & valid.field_0.i[2];
                auVar51._12_4_ = -(uint)(auVar99._12_4_ == auVar43._12_4_) & valid.field_0.i[3];
                iVar20 = movmskps(uVar27,auVar51);
                aVar67 = valid.field_0;
                if (iVar20 != 0) {
                  aVar67.i[2] = auVar51._8_4_;
                  aVar67._0_8_ = auVar51._0_8_;
                  aVar67.i[3] = auVar51._12_4_;
                }
                uVar21 = movmskps(iVar20,(undefined1  [16])aVar67);
                lVar24 = 0;
                if (CONCAT44(uVar22,uVar21) != 0) {
                  for (; (CONCAT44(uVar22,uVar21) >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                  }
                }
LAB_00273e33:
                uVar27 = *(uint *)(lVar12 + 0xc0 + lVar24 * 4);
                pGVar30 = (pSVar10->geometries).items[uVar27].ptr;
                if ((pGVar30->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  valid.field_0.v[lVar24] = 0.0;
LAB_00274178:
                  uVar22 = (undefined4)((ulong)lVar24 >> 0x20);
                  uVar27 = movmskps((int)lVar24,(undefined1  [16])valid.field_0);
                  if (uVar27 == 0) goto LAB_002742dc;
                  auVar43 = blendvps(_DAT_01f7a9f0,auVar135,(undefined1  [16])valid.field_0);
                  auVar102._4_4_ = auVar43._0_4_;
                  auVar102._0_4_ = auVar43._4_4_;
                  auVar102._8_4_ = auVar43._12_4_;
                  auVar102._12_4_ = auVar43._8_4_;
                  auVar99 = minps(auVar102,auVar43);
                  auVar69._0_8_ = auVar99._8_8_;
                  auVar69._8_4_ = auVar99._0_4_;
                  auVar69._12_4_ = auVar99._4_4_;
                  auVar99 = minps(auVar69,auVar99);
                  auVar70._0_8_ =
                       CONCAT44(-(uint)(auVar99._4_4_ == auVar43._4_4_) & valid.field_0._4_4_,
                                -(uint)(auVar99._0_4_ == auVar43._0_4_) & valid.field_0._0_4_);
                  auVar70._8_4_ = -(uint)(auVar99._8_4_ == auVar43._8_4_) & valid.field_0._8_4_;
                  auVar70._12_4_ = -(uint)(auVar99._12_4_ == auVar43._12_4_) & valid.field_0._12_4_;
                  iVar20 = movmskps(uVar27,auVar70);
                  aVar53 = valid.field_0;
                  if (iVar20 != 0) {
                    aVar53.i[2] = auVar70._8_4_;
                    aVar53._0_8_ = auVar70._0_8_;
                    aVar53.i[3] = auVar70._12_4_;
                  }
                  uVar21 = movmskps(iVar20,(undefined1  [16])aVar53);
                  lVar24 = 0;
                  if (CONCAT44(uVar22,uVar21) != 0) {
                    for (; (CONCAT44(uVar22,uVar21) >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                    }
                  }
                  goto LAB_00273e33;
                }
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar30->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_10e8 = *(undefined4 *)(local_1208 + lVar24 * 4);
                  local_10d8 = *(undefined4 *)(local_11f8 + lVar24 * 4);
                  local_1118._4_4_ = *(undefined4 *)(local_11d8 + lVar24 * 4);
                  local_1108._4_4_ = *(undefined4 *)(local_11c8 + lVar24 * 4);
                  local_10b8._4_4_ = uVar27;
                  local_10b8._0_4_ = uVar27;
                  local_10b8._8_4_ = uVar27;
                  local_10b8._12_4_ = uVar27;
                  uVar22 = *(undefined4 *)((long)&local_1288 + lVar24 * 4);
                  local_10c8._4_4_ = uVar22;
                  local_10c8._0_4_ = uVar22;
                  local_10c8._8_4_ = uVar22;
                  local_10c8._12_4_ = uVar22;
                  local_10f8 = *(undefined4 *)(local_11b8 + lVar24 * 4);
                  local_1118._0_4_ = local_1118._4_4_;
                  local_1118._8_4_ = local_1118._4_4_;
                  local_1118._12_4_ = local_1118._4_4_;
                  local_1108._0_4_ = local_1108._4_4_;
                  local_1108._8_4_ = local_1108._4_4_;
                  local_1108._12_4_ = local_1108._4_4_;
                  uStack_10f4 = local_10f8;
                  uStack_10f0 = local_10f8;
                  uStack_10ec = local_10f8;
                  uStack_10e4 = local_10e8;
                  uStack_10e0 = local_10e8;
                  uStack_10dc = local_10e8;
                  uStack_10d4 = local_10d8;
                  uStack_10d0 = local_10d8;
                  uStack_10cc = local_10d8;
                  local_10a8 = context->user->instID[0];
                  uStack_10a4 = local_10a8;
                  uStack_10a0 = local_10a8;
                  uStack_109c = local_10a8;
                  local_1098 = context->user->instPrimID[0];
                  uStack_1094 = local_1098;
                  uStack_1090 = local_1098;
                  uStack_108c = local_1098;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11e8 + lVar24 * 4);
                  local_1338 = *(undefined1 (*) [16])
                                (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                  args.valid = (int *)local_1338;
                  args.geometryUserPtr = pGVar30->userPtr;
                  args.context = context->user;
                  args.hit = (RTCHitN *)local_1118;
                  args.N = 4;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar30->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar30->intersectionFilterN)(&args);
                  }
                  if (local_1338 == (undefined1  [16])0x0) {
                    auVar68._8_4_ = 0xffffffff;
                    auVar68._0_8_ = 0xffffffffffffffff;
                    auVar68._12_4_ = 0xffffffff;
                    auVar68 = auVar68 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var11 = context->args->filter;
                    if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar30->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var11)(&args);
                    }
                    auVar52._0_4_ = -(uint)(local_1338._0_4_ == 0);
                    auVar52._4_4_ = -(uint)(local_1338._4_4_ == 0);
                    auVar52._8_4_ = -(uint)(local_1338._8_4_ == 0);
                    auVar52._12_4_ = -(uint)(local_1338._12_4_ == 0);
                    auVar68 = auVar52 ^ _DAT_01f7ae20;
                    if (local_1338 != (undefined1  [16])0x0) {
                      auVar99 = blendvps(*(undefined1 (*) [16])args.hit,
                                         *(undefined1 (*) [16])(args.ray + 0xc0),auVar52);
                      *(undefined1 (*) [16])(args.ray + 0xc0) = auVar99;
                      auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                         *(undefined1 (*) [16])(args.ray + 0xd0),auVar52);
                      *(undefined1 (*) [16])(args.ray + 0xd0) = auVar99;
                      auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                         *(undefined1 (*) [16])(args.ray + 0xe0),auVar52);
                      *(undefined1 (*) [16])(args.ray + 0xe0) = auVar99;
                      auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                         *(undefined1 (*) [16])(args.ray + 0xf0),auVar52);
                      *(undefined1 (*) [16])(args.ray + 0xf0) = auVar99;
                      auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                         *(undefined1 (*) [16])(args.ray + 0x100),auVar52);
                      *(undefined1 (*) [16])(args.ray + 0x100) = auVar99;
                      auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                         *(undefined1 (*) [16])(args.ray + 0x110),auVar52);
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar99;
                      auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                         *(undefined1 (*) [16])(args.ray + 0x120),auVar52);
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar99;
                      auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                         *(undefined1 (*) [16])(args.ray + 0x130),auVar52);
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar99;
                      auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                         *(undefined1 (*) [16])(args.ray + 0x140),auVar52);
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar99;
                    }
                  }
                  if ((_DAT_01f7bb20 & auVar68) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_1348._0_4_;
                  }
                  else {
                    local_1348._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_1348._4_4_ = 0;
                    local_1348._8_4_ = 0;
                    local_1348._12_4_ = 0;
                  }
                  valid.field_0.v[lVar24] = 0.0;
                  valid.field_0.i[0] =
                       -(uint)(auVar135._0_4_ <= (float)local_1348._0_4_) & valid.field_0.i[0];
                  valid.field_0.i[1] =
                       -(uint)(auVar135._4_4_ <= (float)local_1348._0_4_) & valid.field_0.i[1];
                  valid.field_0.i[2] =
                       -(uint)(auVar135._8_4_ <= (float)local_1348._0_4_) & valid.field_0.i[2];
                  valid.field_0.i[3] =
                       -(uint)(auVar135._12_4_ <= (float)local_1348._0_4_) & valid.field_0.i[3];
                  goto LAB_00274178;
                }
                uVar22 = *(undefined4 *)(local_1208 + lVar24 * 4);
                uVar21 = *(undefined4 *)(local_11f8 + lVar24 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11e8 + lVar24 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_11d8 + lVar24 * 4);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_11c8 + lVar24 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_11b8 + lVar24 * 4);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar22;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar21;
                *(undefined4 *)(ray + k * 4 + 0x110) =
                     *(undefined4 *)((long)&local_1288 + lVar24 * 4);
                *(uint *)(ray + k * 4 + 0x120) = uVar27;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                uVar27 = context->user->instPrimID[0];
                uVar22 = 0;
                *(uint *)(ray + k * 4 + 0x140) = uVar27;
LAB_002742dc:
                fVar126 = *(float *)(lVar12 + 0x30);
                fVar182 = *(float *)(lVar12 + 0x34);
                fVar186 = *(float *)(lVar12 + 0x38);
                fVar117 = *(float *)(lVar12 + 0x3c);
                fVar124 = *(float *)(lVar12 + 0x40);
                fVar125 = *(float *)(lVar12 + 0x44);
                fVar165 = *(float *)(lVar12 + 0x48);
                fVar166 = *(float *)(lVar12 + 0x4c);
                fVar143 = *(float *)(lVar12 + 0x50);
                fVar150 = *(float *)(lVar12 + 0x54);
                fVar152 = *(float *)(lVar12 + 0x58);
                fVar154 = *(float *)(lVar12 + 0x5c);
                local_1298 = *(undefined8 *)(lVar12 + 0x90);
                uStack_1290 = *(undefined8 *)(lVar12 + 0x98);
                local_1318 = *(Geometry **)(lVar12 + 0xa0);
                uStack_1310 = *(undefined8 *)(lVar12 + 0xa8);
                auVar99 = *(undefined1 (*) [16])(lVar12 + 0xb0);
              }
            }
          }
          fVar112 = *(float *)(ray + k * 4);
          fVar91 = *(float *)(ray + k * 4 + 0x10);
          fVar81 = *(float *)(ray + k * 4 + 0x20);
          fVar133 = *(float *)(lVar12 + 0x60) - fVar112;
          fVar137 = *(float *)(lVar12 + 100) - fVar112;
          fVar138 = *(float *)(lVar12 + 0x68) - fVar112;
          fVar139 = *(float *)(lVar12 + 0x6c) - fVar112;
          fVar174 = *(float *)(lVar12 + 0x70) - fVar91;
          fVar179 = *(float *)(lVar12 + 0x74) - fVar91;
          fVar183 = *(float *)(lVar12 + 0x78) - fVar91;
          fVar187 = *(float *)(lVar12 + 0x7c) - fVar91;
          fVar157 = *(float *)(lVar12 + 0x80) - fVar81;
          fVar161 = *(float *)(lVar12 + 0x84) - fVar81;
          fVar162 = *(float *)(lVar12 + 0x88) - fVar81;
          fVar163 = *(float *)(lVar12 + 0x8c) - fVar81;
          local_1298._0_4_ = (float)local_1298 - fVar112;
          local_1298._4_4_ = local_1298._4_4_ - fVar112;
          uStack_1290._0_4_ = (float)uStack_1290 - fVar112;
          uStack_1290._4_4_ = uStack_1290._4_4_ - fVar112;
          fVar108 = (float)local_1318 - fVar91;
          fVar110 = local_1318._4_4_ - fVar91;
          fVar172 = (float)uStack_1310 - fVar91;
          fVar127 = uStack_1310._4_4_ - fVar91;
          fVar156 = auVar99._0_4_ - fVar81;
          fVar164 = auVar99._4_4_ - fVar81;
          fVar167 = auVar99._8_4_ - fVar81;
          fVar93 = auVar99._12_4_ - fVar81;
          fVar126 = fVar126 - fVar112;
          fVar182 = fVar182 - fVar112;
          fVar186 = fVar186 - fVar112;
          fVar117 = fVar117 - fVar112;
          fVar124 = fVar124 - fVar91;
          fVar125 = fVar125 - fVar91;
          fVar165 = fVar165 - fVar91;
          fVar166 = fVar166 - fVar91;
          fVar143 = fVar143 - fVar81;
          fVar150 = fVar150 - fVar81;
          fVar152 = fVar152 - fVar81;
          fVar154 = fVar154 - fVar81;
          fVar89 = fVar126 - fVar133;
          fVar90 = fVar182 - fVar137;
          fVar92 = fVar186 - fVar138;
          fVar107 = fVar117 - fVar139;
          fVar168 = fVar124 - fVar174;
          fVar169 = fVar125 - fVar179;
          fVar170 = fVar165 - fVar183;
          fVar171 = fVar166 - fVar187;
          fVar142 = fVar143 - fVar157;
          fVar149 = fVar150 - fVar161;
          fVar151 = fVar152 - fVar162;
          fVar153 = fVar154 - fVar163;
          fVar112 = *(float *)(ray + k * 4 + 0x50);
          fVar91 = *(float *)(ray + k * 4 + 0x60);
          fVar81 = *(float *)(ray + k * 4 + 0x40);
          fVar189 = (fVar168 * (fVar157 + fVar143) - (fVar174 + fVar124) * fVar142) * fVar81 +
                    ((fVar133 + fVar126) * fVar142 - (fVar157 + fVar143) * fVar89) * fVar112 +
                    (fVar89 * (fVar174 + fVar124) - (fVar133 + fVar126) * fVar168) * fVar91;
          fVar132 = (fVar169 * (fVar161 + fVar150) - (fVar179 + fVar125) * fVar149) * fVar81 +
                    ((fVar137 + fVar182) * fVar149 - (fVar161 + fVar150) * fVar90) * fVar112 +
                    (fVar90 * (fVar179 + fVar125) - (fVar137 + fVar182) * fVar169) * fVar91;
          local_1198 = (undefined1  [8])CONCAT44(fVar132,fVar189);
          fStack_1190 = (fVar170 * (fVar162 + fVar152) - (fVar183 + fVar165) * fVar151) * fVar81 +
                        ((fVar138 + fVar186) * fVar151 - (fVar162 + fVar152) * fVar92) * fVar112 +
                        (fVar92 * (fVar183 + fVar165) - (fVar138 + fVar186) * fVar170) * fVar91;
          fStack_118c = (fVar171 * (fVar163 + fVar154) - (fVar187 + fVar166) * fVar153) * fVar81 +
                        ((fVar139 + fVar117) * fVar153 - (fVar163 + fVar154) * fVar107) * fVar112 +
                        (fVar107 * (fVar187 + fVar166) - (fVar139 + fVar117) * fVar171) * fVar91;
          fVar64 = fVar133 - (float)local_1298;
          fVar78 = fVar137 - local_1298._4_4_;
          fVar80 = fVar138 - (float)uStack_1290;
          fVar82 = fVar139 - uStack_1290._4_4_;
          fVar173 = fVar174 - fVar108;
          fVar178 = fVar179 - fVar110;
          fVar181 = fVar183 - fVar172;
          fVar185 = fVar187 - fVar127;
          fVar109 = fVar157 - fVar156;
          fVar111 = fVar161 - fVar164;
          fVar116 = fVar162 - fVar167;
          fVar131 = fVar163 - fVar93;
          local_1318 = (Geometry *)CONCAT44(fVar161,fVar157);
          uStack_1310 = CONCAT44(fVar163,fVar162);
          local_1178._0_4_ =
               (fVar173 * (fVar157 + fVar156) - (fVar174 + fVar108) * fVar109) * fVar81 +
               ((fVar133 + (float)local_1298) * fVar109 - (fVar157 + fVar156) * fVar64) * fVar112 +
               (fVar64 * (fVar174 + fVar108) - (fVar133 + (float)local_1298) * fVar173) * fVar91;
          local_1178._4_4_ =
               (fVar178 * (fVar161 + fVar164) - (fVar179 + fVar110) * fVar111) * fVar81 +
               ((fVar137 + local_1298._4_4_) * fVar111 - (fVar161 + fVar164) * fVar78) * fVar112 +
               (fVar78 * (fVar179 + fVar110) - (fVar137 + local_1298._4_4_) * fVar178) * fVar91;
          fStack_1170 = (fVar181 * (fVar162 + fVar167) - (fVar183 + fVar172) * fVar116) * fVar81 +
                        ((fVar138 + (float)uStack_1290) * fVar116 - (fVar162 + fVar167) * fVar80) *
                        fVar112 + (fVar80 * (fVar183 + fVar172) -
                                  (fVar138 + (float)uStack_1290) * fVar181) * fVar91;
          fStack_116c = (fVar185 * (fVar163 + fVar93) - (fVar187 + fVar127) * fVar131) * fVar81 +
                        ((fVar139 + uStack_1290._4_4_) * fVar131 - (fVar163 + fVar93) * fVar82) *
                        fVar112 + (fVar82 * (fVar187 + fVar127) -
                                  (fVar139 + uStack_1290._4_4_) * fVar185) * fVar91;
          local_1168 = (float)local_1298 - fVar126;
          fStack_1164 = local_1298._4_4_ - fVar182;
          fStack_1160 = (float)uStack_1290 - fVar186;
          fStack_115c = uStack_1290._4_4_ - fVar117;
          local_1158 = fVar108 - fVar124;
          fStack_1154 = fVar110 - fVar125;
          fStack_1150 = fVar172 - fVar165;
          fStack_114c = fVar127 - fVar166;
          fVar175 = fVar156 - fVar143;
          fVar180 = fVar164 - fVar150;
          fVar184 = fVar167 - fVar152;
          fVar188 = fVar93 - fVar154;
          auVar54._0_4_ =
               (local_1158 * (fVar143 + fVar156) - (fVar124 + fVar108) * fVar175) * fVar81 +
               ((fVar126 + (float)local_1298) * fVar175 - (fVar143 + fVar156) * local_1168) *
               fVar112 + (local_1168 * (fVar124 + fVar108) -
                         (fVar126 + (float)local_1298) * local_1158) * fVar91;
          auVar54._4_4_ =
               (fStack_1154 * (fVar150 + fVar164) - (fVar125 + fVar110) * fVar180) * fVar81 +
               ((fVar182 + local_1298._4_4_) * fVar180 - (fVar150 + fVar164) * fStack_1164) *
               fVar112 + (fStack_1164 * (fVar125 + fVar110) -
                         (fVar182 + local_1298._4_4_) * fStack_1154) * fVar91;
          auVar54._8_4_ =
               (fStack_1150 * (fVar152 + fVar167) - (fVar165 + fVar172) * fVar184) * fVar81 +
               ((fVar186 + (float)uStack_1290) * fVar184 - (fVar152 + fVar167) * fStack_1160) *
               fVar112 + (fStack_1160 * (fVar165 + fVar172) -
                         (fVar186 + (float)uStack_1290) * fStack_1150) * fVar91;
          auVar54._12_4_ =
               (fStack_114c * (fVar154 + fVar93) - (fVar166 + fVar127) * fVar188) * fVar81 +
               ((fVar117 + uStack_1290._4_4_) * fVar188 - (fVar154 + fVar93) * fStack_115c) *
               fVar112 + (fStack_115c * (fVar166 + fVar127) -
                         (fVar117 + uStack_1290._4_4_) * fStack_114c) * fVar91;
          local_1188 = (float)local_1178._0_4_ + fVar189 + auVar54._0_4_;
          fStack_1184 = (float)local_1178._4_4_ + fVar132 + auVar54._4_4_;
          fStack_1180 = fStack_1170 + fStack_1190 + auVar54._8_4_;
          fStack_117c = fStack_116c + fStack_118c + auVar54._12_4_;
          auVar71._8_4_ = fStack_1190;
          auVar71._0_8_ = local_1198;
          auVar71._12_4_ = fStack_118c;
          auVar99 = minps(auVar71,_local_1178);
          auVar99 = minps(auVar99,auVar54);
          auVar146._8_4_ = fStack_1190;
          auVar146._0_8_ = local_1198;
          auVar146._12_4_ = fStack_118c;
          auVar43 = maxps(auVar146,_local_1178);
          auVar43 = maxps(auVar43,auVar54);
          fVar156 = ABS(local_1188) * 1.1920929e-07;
          fVar164 = ABS(fStack_1184) * 1.1920929e-07;
          fVar167 = ABS(fStack_1180) * 1.1920929e-07;
          fVar126 = ABS(fStack_117c) * 1.1920929e-07;
          auVar147._4_4_ = -(uint)(auVar43._4_4_ <= fVar164);
          auVar147._0_4_ = -(uint)(auVar43._0_4_ <= fVar156);
          auVar147._8_4_ = -(uint)(auVar43._8_4_ <= fVar167);
          auVar147._12_4_ = -(uint)(auVar43._12_4_ <= fVar126);
          auVar72._4_4_ = -(uint)(-fVar164 <= auVar99._4_4_);
          auVar72._0_4_ = -(uint)(-fVar156 <= auVar99._0_4_);
          auVar72._8_4_ = -(uint)(-fVar167 <= auVar99._8_4_);
          auVar72._12_4_ = -(uint)(-fVar126 <= auVar99._12_4_);
          auVar147 = auVar147 | auVar72;
          iVar20 = movmskps(uVar27,auVar147);
          if (iVar20 != 0) {
            auVar141._0_4_ = fVar168 * fVar109 - fVar173 * fVar142;
            auVar141._4_4_ = fVar169 * fVar111 - fVar178 * fVar149;
            auVar141._8_4_ = fVar170 * fVar116 - fVar181 * fVar151;
            auVar141._12_4_ = fVar171 * fVar131 - fVar185 * fVar153;
            auVar160._0_4_ = fVar173 * fVar175 - fVar109 * local_1158;
            auVar160._4_4_ = fVar178 * fVar180 - fVar111 * fStack_1154;
            auVar160._8_4_ = fVar181 * fVar184 - fVar116 * fStack_1150;
            auVar160._12_4_ = fVar185 * fVar188 - fVar131 * fStack_114c;
            auVar55._4_4_ = -(uint)(ABS(fVar178 * fVar149) < ABS(fVar111 * fStack_1154));
            auVar55._0_4_ = -(uint)(ABS(fVar173 * fVar142) < ABS(fVar109 * local_1158));
            auVar55._8_4_ = -(uint)(ABS(fVar181 * fVar151) < ABS(fVar116 * fStack_1150));
            auVar55._12_4_ = -(uint)(ABS(fVar185 * fVar153) < ABS(fVar131 * fStack_114c));
            local_11d8 = blendvps(auVar160,auVar141,auVar55);
            auVar103._0_4_ = fVar142 * fVar64 - fVar109 * fVar89;
            auVar103._4_4_ = fVar149 * fVar78 - fVar111 * fVar90;
            auVar103._8_4_ = fVar151 * fVar80 - fVar116 * fVar92;
            auVar103._12_4_ = fVar153 * fVar82 - fVar131 * fVar107;
            auVar115._0_4_ = fVar109 * local_1168 - fVar64 * fVar175;
            auVar115._4_4_ = fVar111 * fStack_1164 - fVar78 * fVar180;
            auVar115._8_4_ = fVar116 * fStack_1160 - fVar80 * fVar184;
            auVar115._12_4_ = fVar131 * fStack_115c - fVar82 * fVar188;
            auVar56._4_4_ = -(uint)(ABS(fVar111 * fVar90) < ABS(fVar78 * fVar180));
            auVar56._0_4_ = -(uint)(ABS(fVar109 * fVar89) < ABS(fVar64 * fVar175));
            auVar56._8_4_ = -(uint)(ABS(fVar116 * fVar92) < ABS(fVar80 * fVar184));
            auVar56._12_4_ = -(uint)(ABS(fVar131 * fVar107) < ABS(fVar82 * fVar188));
            local_11c8 = blendvps(auVar115,auVar103,auVar56);
            auVar177._0_4_ = fVar89 * fVar173 - fVar64 * fVar168;
            auVar177._4_4_ = fVar90 * fVar178 - fVar78 * fVar169;
            auVar177._8_4_ = fVar92 * fVar181 - fVar80 * fVar170;
            auVar177._12_4_ = fVar107 * fVar185 - fVar82 * fVar171;
            auVar130._0_4_ = fVar64 * local_1158 - fVar173 * local_1168;
            auVar130._4_4_ = fVar78 * fStack_1154 - fVar178 * fStack_1164;
            auVar130._8_4_ = fVar80 * fStack_1150 - fVar181 * fStack_1160;
            auVar130._12_4_ = fVar82 * fStack_114c - fVar185 * fStack_115c;
            auVar57._4_4_ = -(uint)(ABS(fVar78 * fVar169) < ABS(fVar178 * fStack_1164));
            auVar57._0_4_ = -(uint)(ABS(fVar64 * fVar168) < ABS(fVar173 * local_1168));
            auVar57._8_4_ = -(uint)(ABS(fVar80 * fVar170) < ABS(fVar181 * fStack_1160));
            auVar57._12_4_ = -(uint)(ABS(fVar82 * fVar171) < ABS(fVar185 * fStack_115c));
            local_11b8 = blendvps(auVar130,auVar177,auVar57);
            fVar156 = fVar81 * local_11d8._0_4_ +
                      fVar112 * local_11c8._0_4_ + fVar91 * local_11b8._0_4_;
            fVar164 = fVar81 * local_11d8._4_4_ +
                      fVar112 * local_11c8._4_4_ + fVar91 * local_11b8._4_4_;
            fVar167 = fVar81 * local_11d8._8_4_ +
                      fVar112 * local_11c8._8_4_ + fVar91 * local_11b8._8_4_;
            fVar112 = fVar81 * local_11d8._12_4_ +
                      fVar112 * local_11c8._12_4_ + fVar91 * local_11b8._12_4_;
            auVar136._0_4_ = fVar156 + fVar156;
            auVar136._4_4_ = fVar164 + fVar164;
            auVar136._8_4_ = fVar167 + fVar167;
            auVar136._12_4_ = fVar112 + fVar112;
            auVar58._0_4_ = fVar174 * local_11c8._0_4_ + fVar157 * local_11b8._0_4_;
            auVar58._4_4_ = fVar179 * local_11c8._4_4_ + fVar161 * local_11b8._4_4_;
            auVar58._8_4_ = fVar183 * local_11c8._8_4_ + fVar162 * local_11b8._8_4_;
            auVar58._12_4_ = fVar187 * local_11c8._12_4_ + fVar163 * local_11b8._12_4_;
            fVar112 = fVar133 * local_11d8._0_4_ + auVar58._0_4_;
            fVar91 = fVar137 * local_11d8._4_4_ + auVar58._4_4_;
            fVar81 = fVar138 * local_11d8._8_4_ + auVar58._8_4_;
            fVar156 = fVar139 * local_11d8._12_4_ + auVar58._12_4_;
            auVar123._0_4_ = fVar112 + fVar112;
            auVar123._4_4_ = fVar91 + fVar91;
            auVar123._8_4_ = fVar81 + fVar81;
            auVar123._12_4_ = fVar156 + fVar156;
            auVar99 = rcpps(auVar58,auVar136);
            fVar112 = auVar99._0_4_;
            fVar91 = auVar99._4_4_;
            fVar81 = auVar99._8_4_;
            fVar156 = auVar99._12_4_;
            fVar164 = ((1.0 - auVar136._0_4_ * fVar112) * fVar112 + fVar112) * auVar123._0_4_;
            fVar167 = ((1.0 - auVar136._4_4_ * fVar91) * fVar91 + fVar91) * auVar123._4_4_;
            fVar81 = ((1.0 - auVar136._8_4_ * fVar81) * fVar81 + fVar81) * auVar123._8_4_;
            fVar156 = ((1.0 - auVar136._12_4_ * fVar156) * fVar156 + fVar156) * auVar123._12_4_;
            fVar91 = *(float *)(ray + k * 4 + 0x80);
            fVar112 = *(float *)(ray + k * 4 + 0x30);
            auVar73._0_4_ = -(uint)(fVar164 <= fVar91 && fVar112 <= fVar164) & auVar147._0_4_;
            auVar73._4_4_ = -(uint)(fVar167 <= fVar91 && fVar112 <= fVar167) & auVar147._4_4_;
            auVar73._8_4_ = -(uint)(fVar81 <= fVar91 && fVar112 <= fVar81) & auVar147._8_4_;
            auVar73._12_4_ = -(uint)(fVar156 <= fVar91 && fVar112 <= fVar156) & auVar147._12_4_;
            iVar20 = movmskps(iVar20,auVar73);
            if (iVar20 != 0) {
              uVar27 = auVar73._0_4_ & -(uint)(auVar136._0_4_ != 0.0);
              uVar65 = auVar73._4_4_ & -(uint)(auVar136._4_4_ != 0.0);
              valid.field_0._0_8_ = CONCAT44(uVar65,uVar27);
              valid.field_0.i[2] = auVar73._8_4_ & -(uint)(auVar136._8_4_ != 0.0);
              valid.field_0.i[3] = auVar73._12_4_ & -(uint)(auVar136._12_4_ != 0.0);
              iVar20 = movmskps(iVar20,(undefined1  [16])valid.field_0);
              if (iVar20 != 0) {
                tNear.field_0.v[2] = fStack_1190;
                tNear.field_0._0_8_ = local_1198;
                tNear.field_0.v[3] = fStack_118c;
                auVar17._4_4_ = fStack_1184;
                auVar17._0_4_ = local_1188;
                auVar17._8_4_ = fStack_1180;
                auVar17._12_4_ = fStack_117c;
                local_11e8._4_4_ = fVar167;
                local_11e8._0_4_ = fVar164;
                fStack_11e0 = fVar81;
                fStack_11dc = fVar156;
                local_11a8._8_8_ = uStack_1000;
                local_11a8._0_8_ = local_1008;
                pSVar10 = context->scene;
                auVar99 = rcpps(auVar123,auVar17);
                fVar126 = auVar99._0_4_;
                fVar182 = auVar99._4_4_;
                fVar186 = auVar99._8_4_;
                fVar117 = auVar99._12_4_;
                fVar124 = (float)DAT_01f7ba10;
                fVar125 = DAT_01f7ba10._4_4_;
                fVar165 = DAT_01f7ba10._12_4_;
                fVar112 = DAT_01f7ba10._8_4_;
                fVar126 = (float)(-(uint)(1e-18 <= ABS(local_1188)) &
                                 (uint)((fVar124 - local_1188 * fVar126) * fVar126 + fVar126));
                fVar182 = (float)(-(uint)(1e-18 <= ABS(fStack_1184)) &
                                 (uint)((fVar125 - fStack_1184 * fVar182) * fVar182 + fVar182));
                fVar186 = (float)(-(uint)(1e-18 <= ABS(fStack_1180)) &
                                 (uint)((fVar112 - fStack_1180 * fVar186) * fVar186 + fVar186));
                fVar117 = (float)(-(uint)(1e-18 <= ABS(fStack_117c)) &
                                 (uint)((fVar165 - fStack_117c * fVar117) * fVar117 + fVar117));
                auVar148._0_4_ = fVar189 * fVar126;
                auVar148._4_4_ = fVar132 * fVar182;
                auVar148._8_4_ = fStack_1190 * fVar186;
                auVar148._12_4_ = fStack_118c * fVar117;
                auVar99 = minps(auVar148,_DAT_01f7ba10);
                auVar190._0_4_ = fVar126 * (float)local_1178._0_4_;
                auVar190._4_4_ = fVar182 * (float)local_1178._4_4_;
                auVar190._8_4_ = fVar186 * fStack_1170;
                auVar190._12_4_ = fVar117 * fStack_116c;
                auVar43 = minps(auVar190,_DAT_01f7ba10);
                auVar88._0_4_ = fVar124 - auVar99._0_4_;
                auVar88._4_4_ = fVar125 - auVar99._4_4_;
                auVar88._8_4_ = fVar112 - auVar99._8_4_;
                auVar88._12_4_ = fVar165 - auVar99._12_4_;
                auVar104._0_4_ = fVar124 - auVar43._0_4_;
                auVar104._4_4_ = fVar125 - auVar43._4_4_;
                auVar104._8_4_ = fVar112 - auVar43._8_4_;
                auVar104._12_4_ = fVar165 - auVar43._12_4_;
                local_1208 = blendvps(auVar99,auVar88,local_11a8);
                local_11f8 = blendvps(auVar43,auVar104,local_11a8);
                auVar59._8_4_ = valid.field_0.i[2];
                auVar59._0_8_ = valid.field_0._0_8_;
                auVar59._12_4_ = valid.field_0.i[3];
                auVar15._4_4_ = fVar167;
                auVar15._0_4_ = fVar164;
                auVar15._8_4_ = fVar81;
                auVar15._12_4_ = fVar156;
                auVar43 = blendvps(_DAT_01f7a9f0,auVar15,auVar59);
                auVar105._4_4_ = auVar43._0_4_;
                auVar105._0_4_ = auVar43._4_4_;
                auVar105._8_4_ = auVar43._12_4_;
                auVar105._12_4_ = auVar43._8_4_;
                auVar99 = minps(auVar105,auVar43);
                auVar60._0_8_ = auVar99._8_8_;
                auVar60._8_4_ = auVar99._0_4_;
                auVar60._12_4_ = auVar99._4_4_;
                auVar99 = minps(auVar60,auVar99);
                auVar61._0_8_ =
                     CONCAT44(-(uint)(auVar99._4_4_ == auVar43._4_4_) & uVar65,
                              -(uint)(auVar99._0_4_ == auVar43._0_4_) & uVar27);
                auVar61._8_4_ = -(uint)(auVar99._8_4_ == auVar43._8_4_) & valid.field_0.i[2];
                auVar61._12_4_ = -(uint)(auVar99._12_4_ == auVar43._12_4_) & valid.field_0.i[3];
                iVar20 = movmskps(iVar20,auVar61);
                aVar74 = valid.field_0;
                if (iVar20 != 0) {
                  aVar74.i[2] = auVar61._8_4_;
                  aVar74._0_8_ = auVar61._0_8_;
                  aVar74.i[3] = auVar61._12_4_;
                }
                uVar21 = movmskps(iVar20,(undefined1  [16])aVar74);
                lVar24 = 0;
                if (CONCAT44(uVar22,uVar21) != 0) {
                  for (; (CONCAT44(uVar22,uVar21) >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                  }
                }
LAB_00274866:
                uVar27 = *(uint *)(lVar12 + 0xc0 + lVar24 * 4);
                pRVar25 = (RTCRayN *)(ulong)uVar27;
                pGVar30 = (pSVar10->geometries).items[(long)pRVar25].ptr;
                if ((pGVar30->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  valid.field_0.v[lVar24] = 0.0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar30->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar22 = *(undefined4 *)(local_1208 + lVar24 * 4);
                    uVar21 = *(undefined4 *)(local_11f8 + lVar24 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11e8 + lVar24 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_11d8 + lVar24 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_11c8 + lVar24 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_11b8 + lVar24 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar22;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar21;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)((long)&local_1288 + lVar24 * 4);
                    *(uint *)(ray + k * 4 + 0x120) = uVar27;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    goto LAB_00274d0e;
                  }
                  local_10e8 = *(undefined4 *)(local_1208 + lVar24 * 4);
                  local_10d8 = *(undefined4 *)(local_11f8 + lVar24 * 4);
                  uVar22 = *(undefined4 *)(local_11d8 + lVar24 * 4);
                  uVar21 = *(undefined4 *)(local_11c8 + lVar24 * 4);
                  local_10b8._4_4_ = uVar27;
                  local_10b8._0_4_ = uVar27;
                  local_10b8._8_4_ = uVar27;
                  local_10b8._12_4_ = uVar27;
                  uVar7 = *(undefined4 *)((long)&local_1288 + lVar24 * 4);
                  local_10c8._4_4_ = uVar7;
                  local_10c8._0_4_ = uVar7;
                  local_10c8._8_4_ = uVar7;
                  local_10c8._12_4_ = uVar7;
                  local_1118._4_4_ = uVar22;
                  local_1118._0_4_ = uVar22;
                  local_1118._8_4_ = uVar22;
                  local_1118._12_4_ = uVar22;
                  local_1108._4_4_ = uVar21;
                  local_1108._0_4_ = uVar21;
                  local_1108._8_4_ = uVar21;
                  local_1108._12_4_ = uVar21;
                  local_10f8 = *(undefined4 *)(local_11b8 + lVar24 * 4);
                  uStack_10f4 = local_10f8;
                  uStack_10f0 = local_10f8;
                  uStack_10ec = local_10f8;
                  uStack_10e4 = local_10e8;
                  uStack_10e0 = local_10e8;
                  uStack_10dc = local_10e8;
                  uStack_10d4 = local_10d8;
                  uStack_10d0 = local_10d8;
                  uStack_10cc = local_10d8;
                  local_10a8 = context->user->instID[0];
                  uStack_10a4 = local_10a8;
                  uStack_10a0 = local_10a8;
                  uStack_109c = local_10a8;
                  local_1098 = context->user->instPrimID[0];
                  uStack_1094 = local_1098;
                  uStack_1090 = local_1098;
                  uStack_108c = local_1098;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11e8 + lVar24 * 4);
                  local_1338 = *(undefined1 (*) [16])
                                (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                  args.valid = (int *)local_1338;
                  args.geometryUserPtr = pGVar30->userPtr;
                  args.context = context->user;
                  args.hit = (RTCHitN *)local_1118;
                  args.N = 4;
                  pRVar25 = (RTCRayN *)pGVar30->intersectionFilterN;
                  args.ray = (RTCRayN *)ray;
                  if (pRVar25 != (RTCRayN *)0x0) {
                    local_1318 = pGVar30;
                    pRVar25 = (RTCRayN *)(*(code *)pRVar25)(&args);
                    pGVar30 = local_1318;
                  }
                  if (local_1338 == (undefined1  [16])0x0) {
                    auVar75._8_4_ = 0xffffffff;
                    auVar75._0_8_ = 0xffffffffffffffff;
                    auVar75._12_4_ = 0xffffffff;
                    auVar75 = auVar75 ^ _DAT_01f7ae20;
                  }
                  else {
                    pRVar25 = (RTCRayN *)context->args->filter;
                    if ((pRVar25 != (RTCRayN *)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar30->field_8).field_0x2 & 0x40) != 0)))) {
                      pRVar25 = (RTCRayN *)(*(code *)pRVar25)(&args);
                    }
                    auVar62._0_4_ = -(uint)(local_1338._0_4_ == 0);
                    auVar62._4_4_ = -(uint)(local_1338._4_4_ == 0);
                    auVar62._8_4_ = -(uint)(local_1338._8_4_ == 0);
                    auVar62._12_4_ = -(uint)(local_1338._12_4_ == 0);
                    auVar75 = auVar62 ^ _DAT_01f7ae20;
                    if (local_1338 != (undefined1  [16])0x0) {
                      auVar99 = blendvps(*(undefined1 (*) [16])args.hit,
                                         *(undefined1 (*) [16])(args.ray + 0xc0),auVar62);
                      *(undefined1 (*) [16])(args.ray + 0xc0) = auVar99;
                      auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                         *(undefined1 (*) [16])(args.ray + 0xd0),auVar62);
                      *(undefined1 (*) [16])(args.ray + 0xd0) = auVar99;
                      auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                         *(undefined1 (*) [16])(args.ray + 0xe0),auVar62);
                      *(undefined1 (*) [16])(args.ray + 0xe0) = auVar99;
                      auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                         *(undefined1 (*) [16])(args.ray + 0xf0),auVar62);
                      *(undefined1 (*) [16])(args.ray + 0xf0) = auVar99;
                      auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                         *(undefined1 (*) [16])(args.ray + 0x100),auVar62);
                      *(undefined1 (*) [16])(args.ray + 0x100) = auVar99;
                      auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                         *(undefined1 (*) [16])(args.ray + 0x110),auVar62);
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar99;
                      auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                         *(undefined1 (*) [16])(args.ray + 0x120),auVar62);
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar99;
                      auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                         *(undefined1 (*) [16])(args.ray + 0x130),auVar62);
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar99;
                      auVar99 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                         *(undefined1 (*) [16])(args.ray + 0x140),auVar62);
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar99;
                      pRVar25 = args.ray;
                    }
                  }
                  if ((_DAT_01f7bb20 & auVar75) == (undefined1  [16])0x0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar91;
                  }
                  else {
                    fVar91 = *(float *)(ray + k * 4 + 0x80);
                  }
                  valid.field_0.v[lVar24] = 0.0;
                  valid.field_0.i[0] = -(uint)(fVar164 <= fVar91) & valid.field_0.i[0];
                  valid.field_0.i[1] = -(uint)(fVar167 <= fVar91) & valid.field_0.i[1];
                  valid.field_0.i[2] = -(uint)(fVar81 <= fVar91) & valid.field_0.i[2];
                  valid.field_0.i[3] = -(uint)(fVar156 <= fVar91) & valid.field_0.i[3];
                }
                iVar20 = movmskps((int)pRVar25,(undefined1  [16])valid.field_0);
                if (iVar20 == 0) goto LAB_00274d0e;
                auVar16._4_4_ = fVar167;
                auVar16._0_4_ = fVar164;
                auVar16._8_4_ = fVar81;
                auVar16._12_4_ = fVar156;
                auVar43 = blendvps(_DAT_01f7a9f0,auVar16,(undefined1  [16])valid.field_0);
                auVar106._4_4_ = auVar43._0_4_;
                auVar106._0_4_ = auVar43._4_4_;
                auVar106._8_4_ = auVar43._12_4_;
                auVar106._12_4_ = auVar43._8_4_;
                auVar99 = minps(auVar106,auVar43);
                auVar76._0_8_ = auVar99._8_8_;
                auVar76._8_4_ = auVar99._0_4_;
                auVar76._12_4_ = auVar99._4_4_;
                auVar99 = minps(auVar76,auVar99);
                auVar77._0_8_ =
                     CONCAT44(-(uint)(auVar99._4_4_ == auVar43._4_4_) & valid.field_0._4_4_,
                              -(uint)(auVar99._0_4_ == auVar43._0_4_) & valid.field_0._0_4_);
                auVar77._8_4_ = -(uint)(auVar99._8_4_ == auVar43._8_4_) & valid.field_0._8_4_;
                auVar77._12_4_ = -(uint)(auVar99._12_4_ == auVar43._12_4_) & valid.field_0._12_4_;
                iVar20 = movmskps(iVar20,auVar77);
                aVar63 = valid.field_0;
                if (iVar20 != 0) {
                  aVar63.i[2] = auVar77._8_4_;
                  aVar63._0_8_ = auVar77._0_8_;
                  aVar63.i[3] = auVar77._12_4_;
                }
                uVar22 = movmskps(iVar20,(undefined1  [16])aVar63);
                uVar26 = CONCAT44((int)((ulong)pRVar25 >> 0x20),uVar22);
                lVar24 = 0;
                if (uVar26 != 0) {
                  for (; (uVar26 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                  }
                }
                goto LAB_00274866;
              }
            }
          }
LAB_00274d0e:
          local_1320 = local_1320 + 1;
        } while (local_1320 != local_1148);
      }
      uVar22 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar43._4_4_ = uVar22;
      auVar43._0_4_ = uVar22;
      auVar43._8_4_ = uVar22;
      auVar43._12_4_ = uVar22;
      auVar99 = local_1138;
      fVar124 = local_1058;
      fVar125 = fStack_1054;
      fVar165 = fStack_1050;
      fVar164 = fStack_104c;
      fVar166 = local_1068;
      fVar143 = fStack_1064;
      fVar150 = fStack_1060;
      fVar167 = fStack_105c;
      fVar126 = local_1128;
      fVar182 = fStack_1124;
      fVar186 = fStack_1120;
      fVar117 = fStack_111c;
      fVar152 = local_1018;
      fVar154 = fStack_1014;
      fVar64 = fStack_1010;
      fVar112 = fStack_100c;
      fVar78 = local_1028;
      fVar80 = fStack_1024;
      fVar82 = fStack_1020;
      fVar91 = fStack_101c;
      fVar89 = local_1038;
      fVar90 = fStack_1034;
      fVar92 = fStack_1030;
      fVar81 = fStack_102c;
      fVar93 = local_1048;
      fVar107 = fStack_1044;
      fVar108 = fStack_1040;
      fVar156 = fStack_103c;
      fVar109 = local_1078;
      fVar110 = fStack_1074;
      fVar111 = fStack_1070;
      fVar172 = fStack_106c;
      fVar116 = local_1088;
      fVar127 = fStack_1084;
      fVar131 = fStack_1080;
      fVar189 = fStack_107c;
    }
    if (pSVar23 == stack) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }